

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_program
clLinkProgram(cl_context context,cl_uint num_devices,cl_device_id *device_list,char *options,
             cl_uint num_input_programs,cl_program *input_programs,
             _func_void_cl_program_void_ptr *pfn_notify,void *user_data,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  uint uVar2;
  CLIntercept *this;
  bool modified;
  bool bVar3;
  int iVar4;
  cl_program program;
  time_point end;
  mapped_type *pmVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *newOptions;
  char *local_88;
  cl_device_id *local_80;
  time_point local_78;
  cl_int localErrorCode;
  time_point local_68;
  __int_type local_60;
  undefined1 local_58 [32];
  cl_context local_38;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clLinkProgram == (cl_api_clLinkProgram)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_program)0x0;
  }
  local_60 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  newOptions = (char *)0x0;
  local_80 = device_list;
  if ((g_pIntercept->m_Config).AppendLinkOptions._M_string_length == 0) {
    modified = false;
  }
  else {
    modified = CLIntercept::appendBuildOptions
                         (g_pIntercept,(g_pIntercept->m_Config).AppendLinkOptions._M_dataplus._M_p,
                          options,&newOptions);
  }
  if (((this->m_Config).RelaxAllocationLimits == true) &&
     (bVar3 = CLIntercept::checkRelaxAllocationLimitsSupport(this,num_devices,local_80), bVar3)) {
    bVar3 = CLIntercept::appendBuildOptions
                      (this,"-cl-intel-greater-than-4GB-buffer-required",options,&newOptions);
    modified = (bool)(modified | bVar3);
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clLinkProgram",local_60,(cl_kernel)0x0,
               "context = %p, num_input_programs = %u, pfn_notify = %p",context,
               (ulong)num_input_programs,pfn_notify);
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret != (cl_int *)0x0) || ((this->m_Config).NoErrors == false)) goto LAB_001121ae;
  }
  else if (errcode_ret != (cl_int *)0x0) goto LAB_001121ae;
  errcode_ret = &localErrorCode;
LAB_001121ae:
  if ((this->m_Config).BuildLogging == true) {
    local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    local_68.__d.__r = (duration)0;
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_78.__d.__r = (duration)0;
  }
  else {
    local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  local_38 = context;
  local_88 = options;
  if (newOptions == (char *)0x0) {
    program = (cl_program)0x0;
  }
  else {
    program = (*(this->m_Dispatch).clLinkProgram)
                        (context,num_devices,local_80,newOptions,num_input_programs,input_programs,
                         pfn_notify,user_data,errcode_ret);
  }
  if (program == (cl_program)0x0) {
    program = (*(this->m_Dispatch).clLinkProgram)
                        (local_38,num_devices,local_80,local_88,num_input_programs,input_programs,
                         pfn_notify,user_data,errcode_ret);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_60 &&
        (local_60 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      input_programs = (cl_program *)(local_58 + 0x10);
      local_58._0_8_ = input_programs;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
      CLIntercept::updateHostTimingStats(this,"clLinkProgram",(string *)local_58,local_78,end);
      if ((cl_program *)local_58._0_8_ != input_programs) {
        operator_delete((void *)local_58._0_8_);
      }
    }
  }
  bVar3 = (this->m_Config).ErrorLogging;
  if ((((bVar3 != false) || ((this->m_Config).ErrorAssert != false)) ||
      ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
    if (bVar3 != false) {
      CLIntercept::logError(this,"clLinkProgram",*errcode_ret);
    }
    if ((this->m_Config).ErrorAssert == true) {
      raise(5);
    }
    if ((this->m_Config).NoErrors == true) {
      *errcode_ret = 0;
    }
  }
  if ((this->m_Config).BuildLogging == true) {
    CLIntercept::logBuild(this,local_68,program,num_devices,local_80);
  }
  if ((program != (cl_program)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Programs;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clLinkProgram",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",program);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    CLIntercept::chromeCallLoggingExit(this,"clLinkProgram",(string *)local_58,false,0,local_78,end)
    ;
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  local_58._0_8_ = program;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar4 == 0) {
    pmVar5 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,(key_type *)local_58);
    uVar2 = this->m_ProgramNumber;
    pmVar5->ProgramNumber = uVar2;
    pmVar5->CompileCount = 0;
    this->m_ProgramNumber = uVar2 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    if (((((((this->m_Config).BuildLogging != false) ||
           ((this->m_Config).KernelNameHashTracking != false)) ||
          (((this->m_Config).DumpProgramSource != false ||
           ((((this->m_Config).DumpInputProgramBinaries != false ||
             ((this->m_Config).DumpProgramBinaries != false)) ||
            ((this->m_Config).DumpProgramSPIRV != false)))))) ||
         (((this->m_Config).DumpProgramBuildLogs != false ||
          ((this->m_Config).DumpKernelISABinaries != false)))) ||
        ((this->m_Config).InjectProgramSource != false)) ||
       (((this->m_Config).AutoCreateSPIRV != false ||
        ((this->m_Config).AubCaptureUniqueKernels == true)))) {
      CLIntercept::saveProgramOptionsHash(this,program,local_88);
    }
    if (((((this->m_Config).DumpProgramSource == false) &&
         ((this->m_Config).DumpInputProgramBinaries == false)) &&
        ((this->m_Config).DumpProgramBinaries == false)) &&
       ((this->m_Config).DumpProgramSPIRV != true)) {
      if ((modified == false) &&
         (((this->m_Config).SimpleDumpProgramSource != false ||
          ((this->m_Config).DumpProgramSourceScript == true)))) {
        pcVar7 = local_88;
        if (newOptions != (char *)0x0) {
          pcVar7 = newOptions;
        }
        CLIntercept::dumpProgramOptionsScript(this,program,pcVar7);
      }
    }
    else {
      pcVar7 = local_88;
      if (newOptions != (char *)0x0) {
        pcVar7 = newOptions;
      }
      CLIntercept::dumpProgramOptions(this,program,modified,0,1,pcVar7);
    }
    if ((this->m_Config).DumpProgramBinaries == true) {
      CLIntercept::dumpProgramBinary(this,program);
    }
    if ((this->m_Config).DumpKernelISABinaries == true) {
      CLIntercept::dumpKernelISABinaries(this,program);
    }
    if ((program != (cl_program)0x0) &&
       (((((this->m_Config).BuildLogging != false ||
          ((this->m_Config).KernelNameHashTracking != false)) ||
         (((this->m_Config).InjectProgramSource != false ||
          (((((this->m_Config).DumpProgramSourceScript != false ||
             ((this->m_Config).DumpProgramSource != false)) ||
            ((this->m_Config).DumpProgramBinaries != false)) ||
           (((this->m_Config).DumpProgramSPIRV != false ||
            ((this->m_Config).DumpProgramBuildLogs != false)))))))) ||
        (((this->m_Config).DumpKernelISABinaries != false ||
         (((this->m_Config).AutoCreateSPIRV != false ||
          ((this->m_Config).AubCaptureUniqueKernels == true)))))))) {
      CLIntercept::incrementProgramCompileCount(this,program);
    }
    if (newOptions != (char *)0x0) {
      operator_delete__(newOptions);
    }
    return program;
  }
  uVar6 = std::__throw_system_error(iVar4);
  if ((cl_program *)local_58._0_8_ != input_programs) {
    operator_delete((void *)local_58._0_8_);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

CL_API_ENTRY cl_program CL_API_CALL CLIRN(clLinkProgram)(
    cl_context context,
    cl_uint num_devices,
    const cl_device_id* device_list,
    const char* options,
    cl_uint num_input_programs,
    const cl_program* input_programs,
    void (CL_CALLBACK *pfn_notify)(cl_program program, void* user_data),
    void* user_data,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clLinkProgram )
    {
        GET_ENQUEUE_COUNTER();

        const bool isCompile = false;
        const bool isLink = true;
        char*   newOptions = NULL;

        PROGRAM_LINK_OPTIONS_OVERRIDE_INIT( num_devices, device_list, options, newOptions );

        CALL_LOGGING_ENTER( "context = %p, num_input_programs = %u, pfn_notify = %p",
            context,
            num_input_programs,
            pfn_notify );
        CHECK_ERROR_INIT( errcode_ret );
        BUILD_LOGGING_INIT();
        HOST_PERFORMANCE_TIMING_START();

        cl_program  retVal = NULL;

        if( newOptions != NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                newOptions,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                options,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        BUILD_LOGGING( retVal, num_devices, device_list );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        // TODO: How do we compute a hash for the linked program?
        // This is a new program object, so we don't currently have a hash for it.
        SAVE_PROGRAM_NUMBER( retVal );
        SAVE_PROGRAM_OPTIONS_HASH( retVal, options );
        DUMP_PROGRAM_OPTIONS( retVal, newOptions ? newOptions : options, isCompile, isLink );
        DUMP_OUTPUT_PROGRAM_BINARIES( retVal );
        DUMP_KERNEL_ISA_BINARIES( retVal );
        INCREMENT_PROGRAM_COMPILE_COUNT( retVal );
        PROGRAM_OPTIONS_CLEANUP( newOptions );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}